

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# detail_traits.h
# Opt level: O0

Shape * dukglue::detail::apply_fp<Shape*,std::__cxx11::string_const&,std::__cxx11::string>
                  (_func_Shape_ptr_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr
                   *pf,tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *tup)

{
  Shape *pSVar1;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_40;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *local_18;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *tup_local
  ;
  _func_Shape_ptr_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr *pf_local;
  
  local_18 = tup;
  tup_local = (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)pf;
  std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  tuple(&local_40,tup);
  pSVar1 = apply_fp_helper<Shape*,std::__cxx11::string_const&,std::__cxx11::string,0ul>
                     (pf,&local_40);
  std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~tuple(&local_40);
  return pSVar1;
}

Assistant:

Ret apply_fp(Ret(*pf)(Args...), const std::tuple<BakedArgs...>&  tup)
        {
            return apply_fp_helper(pf, typename make_indexes<BakedArgs...>::type(), std::tuple<BakedArgs...>(tup));
        }